

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O3

void * __thiscall
embree::sse2::BVHBuilderBinnedFastSpatialSAH::
CreateLeafExt<void*,embree::sse2::rtcBuildBVHSpatialSAH(RTCBuildArguments_const*)::$_4>::operator()
          (CreateLeafExt<void*,embree::sse2::rtcBuildBVHSpatialSAH(RTCBuildArguments_const*)::__4>
           *this,PrimRef *prims,range<unsigned_long> *range,CachedAllocator alloc)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 *puVar4;
  
  uVar3 = range->_begin;
  uVar2 = range->_end;
  if (uVar3 < uVar2) {
    puVar4 = (undefined1 *)((long)&prims[uVar3].lower.field_0 + 0xc);
    do {
      puVar4[3] = puVar4[3] & 7;
      uVar3 = uVar3 + 1;
      uVar2 = range->_end;
      puVar4 = puVar4 + 0x20;
    } while (uVar3 < uVar2);
    uVar3 = range->_begin;
  }
  pvVar1 = (void *)(*(code *)**(undefined8 **)this)
                             (&alloc,prims + uVar3,uVar2 - uVar3,**(undefined8 **)(this + 8));
  return pvVar1;
}

Assistant:

__noinline ReductionTy operator() (PrimRef* prims, const range<size_t>& range, Allocator alloc) const
        {
          for (size_t i=range.begin(); i<range.end(); i++)
            prims[i].lower.u &= GEOMID_MASK;

          return userCreateLeaf(prims,range,alloc);
        }